

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMDisassembler.c
# Opt level: O0

_Bool EVM_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,
                        uint64_t address,void *inst_info)

{
  undefined1 uVar1;
  uint *in_RCX;
  ulong in_RDX;
  byte *in_RSI;
  short *in_R8;
  undefined8 in_R9;
  uchar len;
  uchar opcode;
  cs_insn *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc6;
  byte bVar2;
  _Bool local_1;
  
  if (in_RDX == 0) {
    local_1 = false;
  }
  else {
    bVar2 = *in_RSI;
    if (opcodes[bVar2] == -1) {
      local_1 = false;
    }
    else {
      *(undefined8 *)(in_RCX + 0xc6) = in_R9;
      in_RCX[2] = (uint)bVar2;
      *in_RCX = (uint)bVar2;
      if ((bVar2 < 0x60) || (0x7f < bVar2)) {
        *in_R8 = 1;
      }
      else {
        in_stack_ffffffffffffffc6 = bVar2 + 0xa1;
        if (in_RDX < (ulong)(long)(int)(in_stack_ffffffffffffffc6 + 1)) {
          return false;
        }
        *in_R8 = in_stack_ffffffffffffffc6 + 1;
        memcpy((void *)((long)in_RCX + 0x339),in_RSI + 1,(ulong)in_stack_ffffffffffffffc6);
      }
      if (*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) != 0) {
        memset(*(void **)(*(long *)(in_RCX + 0xc4) + 0xf0),0,0x60);
        EVM_get_insn_id((cs_struct *)
                        CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)
                                ),in_stack_ffffffffffffffb8,0);
        if (*(char *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x58) != '\0') {
          *(undefined1 *)
           (*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x4b +
           (ulong)*(byte *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x53)) = 10;
          *(char *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x53) =
               *(char *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x53) + '\x01';
        }
        if (*(char *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x59) != '\0') {
          *(undefined1 *)
           (*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x4b +
           (ulong)*(byte *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x53)) = 9;
          *(char *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x53) =
               *(char *)(*(long *)(*(long *)(in_RCX + 0xc4) + 0xf0) + 0x53) + '\x01';
        }
        uVar1 = (*(code *)(&DAT_007ae520 + *(int *)(&DAT_007ae520 + (ulong)bVar2 * 4)))();
        return (_Bool)uVar1;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool EVM_getInstruction(csh ud, const uint8_t *code, size_t code_len,
	MCInst *MI, uint16_t *size, uint64_t address, void *inst_info)
{
	unsigned char opcode;

	if (code_len == 0)
		return false;

	opcode = code[0];
	if (opcodes[opcode] == -1) {
		// invalid opcode
		return false;
	}

	// valid opcode
	MI->address = address;
	MI->OpcodePub = MI->Opcode = opcode;

	if (opcode >= EVM_INS_PUSH1 && opcode <= EVM_INS_PUSH32) {
		unsigned char len = (opcode - EVM_INS_PUSH1 + 1);
		if (code_len < 1 + len) {
			// not enough data
			return false;
		}

		*size = 1 + len;
		memcpy(MI->evm_data, code + 1, len);
	} else
		*size = 1;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, evm)+sizeof(cs_evm));
		EVM_get_insn_id((cs_struct *)ud, MI->flat_insn, opcode);

		if (MI->flat_insn->detail->evm.pop) {
			MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STACK_READ;
			MI->flat_insn->detail->groups_count++;
		}

		if (MI->flat_insn->detail->evm.push) {
			MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STACK_WRITE;
			MI->flat_insn->detail->groups_count++;
		}

		// setup groups
		switch(opcode) {
			default:
				break;
			case EVM_INS_ADD:
			case EVM_INS_MUL:
			case EVM_INS_SUB:
			case EVM_INS_DIV:
			case EVM_INS_SDIV:
			case EVM_INS_MOD:
			case EVM_INS_SMOD:
			case EVM_INS_ADDMOD:
			case EVM_INS_MULMOD:
			case EVM_INS_EXP:
			case EVM_INS_SIGNEXTEND:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_MATH;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_MSTORE:
			case EVM_INS_MSTORE8:
			case EVM_INS_CALLDATACOPY:
			case EVM_INS_CODECOPY:
			case EVM_INS_EXTCODECOPY:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_MEM_WRITE;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_MLOAD:
			case EVM_INS_CREATE:
			case EVM_INS_CALL:
			case EVM_INS_CALLCODE:
			case EVM_INS_RETURN:
			case EVM_INS_DELEGATECALL:
			case EVM_INS_REVERT:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_MEM_READ;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_SSTORE:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STORE_WRITE;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_SLOAD:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_STORE_READ;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_JUMP:
			case EVM_INS_JUMPI:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_JUMP;
				MI->flat_insn->detail->groups_count++;
				break;

			case EVM_INS_STOP:
			case EVM_INS_SUICIDE:
				MI->flat_insn->detail->groups[MI->flat_insn->detail->groups_count] = EVM_GRP_HALT;
				MI->flat_insn->detail->groups_count++;
				break;

		}
	}

	return true;
}